

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O0

AMQP_DEVICE_CONFIG * clone_device_config(AMQP_DEVICE_CONFIG *config)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  LOGGER_LOG l_1;
  int result;
  LOGGER_LOG l;
  AMQP_DEVICE_CONFIG *new_config;
  AMQP_DEVICE_CONFIG *config_local;
  
  l = (LOGGER_LOG)malloc(0x48);
  if ((AMQP_DEVICE_CONFIG *)l == (AMQP_DEVICE_CONFIG *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                ,"clone_device_config",0x1e8,1,
                "Failed copying the AMQP_DEVICE_CONFIG (malloc failed)");
    }
  }
  else {
    memset(l,0,0x48);
    iVar1 = mallocAndStrcpy_s(&((AMQP_DEVICE_CONFIG *)l)->iothub_host_fqdn,config->iothub_host_fqdn)
    ;
    if (iVar1 == 0) {
      ((AMQP_DEVICE_CONFIG *)l)->authorization_module = config->authorization_module;
      ((AMQP_DEVICE_CONFIG *)l)->authentication_mode = config->authentication_mode;
      ((AMQP_DEVICE_CONFIG *)l)->on_state_changed_callback = config->on_state_changed_callback;
      ((AMQP_DEVICE_CONFIG *)l)->on_state_changed_context = config->on_state_changed_context;
      pcVar3 = IoTHubClient_Auth_Get_DeviceId(config->authorization_module);
      ((AMQP_DEVICE_CONFIG *)l)->device_id = pcVar3;
      pcVar3 = IoTHubClient_Auth_Get_ModuleId(config->authorization_module);
      ((AMQP_DEVICE_CONFIG *)l)->module_id = pcVar3;
      ((AMQP_DEVICE_CONFIG *)l)->prod_info_cb = config->prod_info_cb;
      ((AMQP_DEVICE_CONFIG *)l)->prod_info_ctx = config->prod_info_ctx;
      l_1._4_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                  ,"clone_device_config",0x1f1,1,
                  "Failed copying the AMQP_DEVICE_CONFIG (failed copying iothub_host_fqdn)");
      }
      l_1._4_4_ = 0x1f2;
    }
    if (l_1._4_4_ != 0) {
      destroy_device_config((AMQP_DEVICE_CONFIG *)l);
      l = (LOGGER_LOG)0x0;
    }
  }
  return (AMQP_DEVICE_CONFIG *)l;
}

Assistant:

static AMQP_DEVICE_CONFIG* clone_device_config(AMQP_DEVICE_CONFIG *config)
{
    AMQP_DEVICE_CONFIG* new_config;

    if ((new_config = (AMQP_DEVICE_CONFIG*)malloc(sizeof(AMQP_DEVICE_CONFIG))) == NULL)
    {
        LogError("Failed copying the AMQP_DEVICE_CONFIG (malloc failed)");
    }
    else
    {
        int result;
        memset(new_config, 0, sizeof(AMQP_DEVICE_CONFIG));

        if (mallocAndStrcpy_s(&new_config->iothub_host_fqdn, config->iothub_host_fqdn) != RESULT_OK)
        {
            LogError("Failed copying the AMQP_DEVICE_CONFIG (failed copying iothub_host_fqdn)");
            result = MU_FAILURE;
        }
        else
        {
            new_config->authorization_module = config->authorization_module;
            new_config->authentication_mode = config->authentication_mode;
            new_config->on_state_changed_callback = config->on_state_changed_callback;
            new_config->on_state_changed_context = config->on_state_changed_context;
            new_config->device_id = IoTHubClient_Auth_Get_DeviceId(config->authorization_module);
            new_config->module_id = IoTHubClient_Auth_Get_ModuleId(config->authorization_module);
            new_config->prod_info_cb = config->prod_info_cb;
            new_config->prod_info_ctx = config->prod_info_ctx;
            result = RESULT_OK;
        }

        if (result != RESULT_OK)
        {
            destroy_device_config(new_config);
            new_config = NULL;
        }
    }

    return new_config;
}